

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::NegativeVertexAttribFormat::Run(NegativeVertexAttribFormat *this)

{
  CallLogWrapper *this_00;
  GLenum GVar1;
  undefined8 in_RAX;
  char *format;
  GLint p;
  
  p = (GLint)((ulong)in_RAX >> 0x20);
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,1000,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8869,&p);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,p + 1,4,0x1406,'\0',0);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,p + 2,4,0x1404,0);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glVertexAttribLFormat(this_00,p + 3,4,0x140a,0);
      GVar1 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar1 == 0x501) {
        glu::CallLogWrapper::glVertexAttribFormat(this_00,0,0,0x1406,'\0',0);
        GVar1 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar1 == 0x501) {
          glu::CallLogWrapper::glVertexAttribFormat(this_00,0,5,0x1406,'\0',0);
          GVar1 = glu::CallLogWrapper::glGetError(this_00);
          if (GVar1 == 0x501) {
            glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,5,0x1404,0);
            GVar1 = glu::CallLogWrapper::glGetError(this_00);
            if (GVar1 == 0x501) {
              glu::CallLogWrapper::glVertexAttribLFormat(this_00,0,0,0x140a,0);
              GVar1 = glu::CallLogWrapper::glGetError(this_00);
              if (GVar1 == 0x501) {
                glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,0x80e1,0x1404,0);
                GVar1 = glu::CallLogWrapper::glGetError(this_00);
                if (GVar1 - 0x503 < 0xfffffffe) goto LAB_00a8cf26;
                glu::CallLogWrapper::glVertexAttribLFormat(this_00,0,0x80e1,0x140a,0);
                GVar1 = glu::CallLogWrapper::glGetError(this_00);
                if (0xfffffffd < GVar1 - 0x503) {
                  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x822e,'\0',0);
                  GVar1 = glu::CallLogWrapper::glGetError(this_00);
                  format = "INVALID_ENUM should be generated.\n";
                  if (GVar1 != 0x500) goto LAB_00a8cf57;
                  glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,4,0x1406,0);
                  GVar1 = glu::CallLogWrapper::glGetError(this_00);
                  if (GVar1 != 0x500) goto LAB_00a8cf57;
                  glu::CallLogWrapper::glVertexAttribLFormat(this_00,0,4,0x1404,0);
                  GVar1 = glu::CallLogWrapper::glGetError(this_00);
                  if (GVar1 != 0x500) goto LAB_00a8cf57;
                  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,0x80e1,0x1406,'\x01',0);
                  GVar1 = glu::CallLogWrapper::glGetError(this_00);
                  if (GVar1 == 0x502) {
                    glu::CallLogWrapper::glVertexAttribFormat(this_00,0,3,0x8d9f,'\0',0);
                    GVar1 = glu::CallLogWrapper::glGetError(this_00);
                    if (GVar1 == 0x502) {
                      glu::CallLogWrapper::glVertexAttribFormat(this_00,0,0x80e1,0x1401,'\0',0);
                      GVar1 = glu::CallLogWrapper::glGetError(this_00);
                      if (GVar1 == 0x502) {
                        glu::CallLogWrapper::glGetIntegerv(this_00,0x82d9,&p);
                        glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x1406,'\0',p + 10);
                        GVar1 = glu::CallLogWrapper::glGetError(this_00);
                        if (GVar1 == 0x501) {
                          glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,4,0x1404,p + 10);
                          GVar1 = glu::CallLogWrapper::glGetError(this_00);
                          if (GVar1 == 0x501) {
                            glu::CallLogWrapper::glVertexAttribLFormat(this_00,0,4,0x140a,p + 10);
                            GVar1 = glu::CallLogWrapper::glGetError(this_00);
                            format = "INVALID_VALUE should be generated.\n";
                            if (GVar1 != 0x501) goto LAB_00a8cf57;
                            glu::CallLogWrapper::glBindVertexArray(this_00,0);
                            glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x1406,'\0',0);
                            GVar1 = glu::CallLogWrapper::glGetError(this_00);
                            if (GVar1 == 0x502) {
                              glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,4,0x1404,0);
                              GVar1 = glu::CallLogWrapper::glGetError(this_00);
                              if (GVar1 == 0x502) {
                                glu::CallLogWrapper::glVertexAttribLFormat(this_00,0,4,0x140a,0);
                                GVar1 = glu::CallLogWrapper::glGetError(this_00);
                                format = "INVALID_OPERATION should be generated.\n";
                                if (GVar1 == 0x502) {
                                  return 0;
                                }
                                goto LAB_00a8cf57;
                              }
                            }
                            goto LAB_00a8cf26;
                          }
                        }
                        goto LAB_00a8cf54;
                      }
                    }
                  }
LAB_00a8cf26:
                  format = "INVALID_OPERATION should be generated.\n";
                  goto LAB_00a8cf57;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00a8cf54:
  format = "INVALID_VALUE should be generated.\n";
LAB_00a8cf57:
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		GLenum glError;

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &p);
		glVertexAttribFormat(p + 1, 4, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(p + 2, 4, GL_INT, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(p + 3, 4, GL_DOUBLE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}

		glVertexAttribFormat(0, 0, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, 5, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 5, GL_INT, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 0, GL_DOUBLE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, GL_BGRA, GL_INT, 0);
		glError = glGetError();
		if (glError != GL_INVALID_OPERATION && glError != GL_INVALID_VALUE)
		{
			//two possible errors here: INVALID_VALUE because GL_BGRA used in *IFormat
			//function AND INVALID_OPERATION because GL_BGRA used with GL_INT
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, GL_BGRA, GL_DOUBLE, 0);
		glError = glGetError();
		if (glError != GL_INVALID_OPERATION && glError != GL_INVALID_VALUE)
		{
			//two possible errors here: INVALID_VALUE because GL_BGRA used in *IFormat
			//function AND INVALID_OPERATION because GL_BGRA used with GL_DOUBLE
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, 4, GL_R32F, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			Output("INVALID_ENUM should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 4, GL_FLOAT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			Output("INVALID_ENUM should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 4, GL_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			Output("INVALID_ENUM should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, GL_BGRA, GL_FLOAT, GL_TRUE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, 3, GL_INT_2_10_10_10_REV, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, GL_BGRA, GL_UNSIGNED_BYTE, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, p + 10);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 4, GL_INT, p + 10);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 4, GL_DOUBLE, p + 10);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glBindVertexArray(0);
		glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 4, GL_INT, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 4, GL_DOUBLE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		return NO_ERROR;
	}